

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O2

void tgt_encode(opj_bio_t *bio,opj_tgt_tree_t *tree,OPJ_UINT32 leafno,OPJ_INT32 threshold)

{
  opj_tgt_node *poVar1;
  opj_tgt_node_t *poVar2;
  int iVar3;
  int iVar4;
  opj_tgt_node_t **ppoVar5;
  opj_tgt_node_t *stk [31];
  
  ppoVar5 = stk;
  poVar2 = tree->nodes + leafno;
  while (poVar1 = poVar2->parent, poVar1 != (opj_tgt_node *)0x0) {
    *ppoVar5 = poVar2;
    ppoVar5 = ppoVar5 + 1;
    poVar2 = poVar1;
  }
  iVar3 = 0;
  do {
    iVar4 = poVar2->low;
    if (poVar2->low < iVar3) {
      poVar2->low = iVar3;
      iVar4 = iVar3;
    }
    iVar3 = iVar4;
    if (iVar4 <= threshold) {
      iVar3 = threshold;
    }
    for (; iVar3 != iVar4; iVar4 = iVar4 + 1) {
      if (poVar2->value <= iVar4) {
        iVar3 = iVar4;
        if (poVar2->known == 0) {
          bio_write(bio,1,1);
          poVar2->known = 1;
        }
        break;
      }
      bio_write(bio,0,1);
    }
    poVar2->low = iVar3;
    if (ppoVar5 == stk) {
      return;
    }
    poVar2 = ppoVar5[-1];
    ppoVar5 = ppoVar5 + -1;
  } while( true );
}

Assistant:

void tgt_encode(opj_bio_t *bio, opj_tgt_tree_t *tree, OPJ_UINT32 leafno, OPJ_INT32 threshold) {
	opj_tgt_node_t *stk[31];
	opj_tgt_node_t **stkptr;
	opj_tgt_node_t *node;
	OPJ_INT32 low;

	stkptr = stk;
	node = &tree->nodes[leafno];
	while (node->parent) {
		*stkptr++ = node;
		node = node->parent;
	}
	
	low = 0;
	for (;;) {
		if (low > node->low) {
			node->low = low;
		} else {
			low = node->low;
		}
		
		while (low < threshold) {
			if (low >= node->value) {
				if (!node->known) {
					bio_write(bio, 1, 1);
					node->known = 1;
				}
				break;
			}
			bio_write(bio, 0, 1);
			++low;
		}
		
		node->low = low;
		if (stkptr == stk)
			break;
		node = *--stkptr;
	}
}